

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_node.cpp
# Opt level: O0

void duckdb::Node16::InsertChild(ART *art,Node *node,uint8_t byte,Node child)

{
  BaseNode<(unsigned_char)__x10_,_(duckdb::NType)4> *n;
  Node in_RCX;
  uint8_t in_DL;
  ART *in_RSI;
  IndexPointer in_RDI;
  Node node16;
  Node16 *n16;
  undefined8 in_stack_ffffffffffffffc0;
  ART *in_stack_ffffffffffffffc8;
  undefined7 in_stack_ffffffffffffffe0;
  
  n = &Node::Ref<duckdb::Node16>
                 (in_stack_ffffffffffffffc8,(Node)(in_RSI->super_BoundIndex).super_Index._vptr_Index
                  ,(NType)((ulong)in_stack_ffffffffffffffc0 >> 0x38))->
       super_BaseNode<(unsigned_char)__x10_,_(duckdb::NType)4>;
  if (n->count == '\x10') {
    Node48::GrowNode16((ART *)in_RDI.data,(Node *)in_RSI,
                       (Node *)CONCAT17(in_DL,in_stack_ffffffffffffffe0));
    Node48::InsertChild(in_RSI,(Node *)CONCAT17(in_DL,in_stack_ffffffffffffffe0),
                        (uint8_t)((ulong)n >> 0x38),(Node)in_RDI.data);
  }
  else {
    BaseNode<(unsigned_char)'\x10',_(duckdb::NType)4>::InsertChildInternal(n,in_DL,in_RCX);
  }
  return;
}

Assistant:

void Node16::InsertChild(ART &art, Node &node, const uint8_t byte, const Node child) {
	// The node is full. Grow to Node48.
	auto &n16 = Node::Ref<Node16>(art, node, NODE_16);
	if (n16.count == CAPACITY) {
		auto node16 = node;
		Node48::GrowNode16(art, node, node16);
		Node48::InsertChild(art, node, byte, child);
		return;
	}

	InsertChildInternal(n16, byte, child);
}